

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

State * __thiscall despot::BaseTag::CreateStartState(BaseTag *this,string type)

{
  TagState *pTVar1;
  undefined8 uVar2;
  int iVar3;
  State *pSVar4;
  
  iVar3 = despot::Random::NextInt(0x121170);
  pSVar4 = (State *)operator_new(0x20);
  pTVar1 = (this->states_).
           super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
           super__Vector_impl_data._M_start[iVar3];
  pSVar4[8] = (State)pTVar1->field_0x8;
  *(undefined4 *)(pSVar4 + 0x1c) = *(undefined4 *)&pTVar1->field_0x1c;
  uVar2 = *(undefined8 *)&pTVar1->field_0x14;
  *(undefined8 *)(pSVar4 + 0xc) = *(undefined8 *)&pTVar1->field_0xc;
  *(undefined8 *)(pSVar4 + 0x14) = uVar2;
  *(undefined ***)pSVar4 = &PTR__State_0011f3c8;
  return pSVar4;
}

Assistant:

State* BaseTag::CreateStartState(string type) const {
	int n = Random::RANDOM.NextInt(states_.size());
	return new TagState(*states_[n]);
}